

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O1

int __thiscall vkt::ubo::UniformBlockCase::init(UniformBlockCase *this,EVP_PKEY_CTX *ctx)

{
  ShaderInterface *this_00;
  UniformLayout *layout;
  pointer *pppSVar1;
  DataType dataType;
  MatrixLoadFlags MVar2;
  UniformBlock *pUVar3;
  pointer pBVar4;
  pointer pUVar5;
  pointer pUVar6;
  iterator __position;
  pointer puVar7;
  _Base_ptr p_Var8;
  uint uVar9;
  int iVar10;
  int iVar11;
  DataType DVar12;
  int iVar13;
  deUint32 dVar14;
  deBool dVar15;
  long *plVar16;
  pointer pBVar17;
  mapped_type *ppvVar18;
  _Rb_tree_header *p_Var19;
  char *pcVar20;
  size_t sVar21;
  pointer pSVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  uint uVar24;
  long *plVar25;
  _Rb_tree_header *p_Var26;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar27;
  undefined8 extraout_RDX_02;
  int iVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  pointer ppSVar32;
  long lVar33;
  pointer __rhs;
  long lVar34;
  bool bVar35;
  bool bVar36;
  string blockPrefix;
  int curOffset;
  Random rnd;
  MatrixLoadFlags in_stack_fffffffffffffd48;
  vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_> local_288;
  long lStack_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  ulong local_240;
  ulong local_238;
  int local_22c;
  long local_228;
  ulong local_220;
  ulong local_218;
  pointer local_210;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  _Rb_tree_header *local_1e8;
  ulong local_1e0;
  long local_1d8;
  ulong local_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  BlockLayoutEntry local_1a8;
  ios_base local_138 [264];
  
  layout = &this->m_uniformLayout;
  local_240 = (ulong)((long)(this->m_interface).m_uniformBlocks.
                            super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_interface).m_uniformBlocks.
                           super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4;
  if (0 < (int)(uint)local_240) {
    local_240 = (ulong)((uint)local_240 & 0x7fffffff);
    lVar30 = 0;
    do {
      pUVar3 = (this->m_interface).m_uniformBlocks.
               super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar30].m_ptr;
      local_228 = lVar30;
      if ((pUVar3->m_instanceName)._M_string_length == 0) {
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        local_260._M_string_length = 0;
        local_260.field_2._M_local_buf[0] = '\0';
      }
      else {
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        lVar30 = *(long *)&(pUVar3->m_blockName)._M_dataplus;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_260,lVar30,(pUVar3->m_blockName)._M_string_length + lVar30);
        std::__cxx11::string::append((char *)&local_260);
      }
      local_22c = 0;
      local_238 = (long)(this->m_uniformLayout).uniforms.
                        super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_uniformLayout).uniforms.
                        super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      __rhs = *(pointer *)
               &(pUVar3->m_uniforms).
                super__Vector_base<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>._M_impl;
      if (__rhs != *(pointer *)
                    ((long)&(pUVar3->m_uniforms).
                            super__Vector_base<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>
                    + 8)) {
        pBVar17 = (this->m_uniformLayout).blocks.
                  super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pBVar4 = (this->m_uniformLayout).blocks.
                 super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::operator+(&local_1a8.name,&local_260,&__rhs->m_name);
          uVar9 = __rhs->m_flags;
          uVar24 = uVar9;
          if ((uVar9 & 0x20) == 0) {
            uVar24 = pUVar3->m_flags;
          }
          if ((uVar9 & 0xc0) == 0) {
            uVar9 = pUVar3->m_flags;
          }
          ubo::anon_unknown_0::computeStd140Layout
                    (layout,&local_22c,
                     (int)((ulong)((long)pBVar17 - (long)pBVar4) >> 4) * -0x33333333,&local_1a8.name
                     ,&__rhs->m_type,uVar9 & 0xc0 | uVar24 & 0x20);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8.name._M_dataplus._M_p != &local_1a8.name.field_2) {
            operator_delete(local_1a8.name._M_dataplus._M_p,
                            CONCAT71(local_1a8.name.field_2._M_allocated_capacity._1_7_,
                                     local_1a8.name.field_2._M_local_buf[0]) + 1);
          }
          __rhs = __rhs + 1;
        } while (__rhs != *(pointer *)
                           ((long)&(pUVar3->m_uniforms).
                                   super__Vector_base<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>
                           + 8));
      }
      iVar11 = local_22c;
      pUVar5 = (this->m_uniformLayout).uniforms.
               super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pUVar6 = (this->m_uniformLayout).uniforms.
               super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_238 = local_238 >> 6;
      iVar28 = pUVar3->m_arraySize;
      if (pUVar3->m_arraySize < 2) {
        iVar28 = 1;
      }
      iVar10 = 0;
      do {
        local_1a8.name._M_dataplus._M_p = (pointer)&local_1a8.name.field_2;
        local_1a8.name._M_string_length = 0;
        local_1a8.name.field_2._M_local_buf[0] = '\0';
        local_1a8.size = 0;
        local_1a8.activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1a8.activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1a8.activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1a8.blockDeclarationNdx = -1;
        local_1a8.bindingNdx = -1;
        local_1a8.instanceNdx = -1;
        std::vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>::
        emplace_back<vkt::ubo::BlockLayoutEntry>(&layout->blocks,&local_1a8);
        if (local_1a8.activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1a8.activeUniformIndices.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1a8.activeUniformIndices.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1a8.activeUniformIndices.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8.name._M_dataplus._M_p != &local_1a8.name.field_2) {
          operator_delete(local_1a8.name._M_dataplus._M_p,
                          CONCAT71(local_1a8.name.field_2._M_allocated_capacity._1_7_,
                                   local_1a8.name.field_2._M_local_buf[0]) + 1);
        }
        pBVar4 = (this->m_uniformLayout).blocks.
                 super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pBVar17 = pBVar4 + -1;
        std::__cxx11::string::_M_assign((string *)pBVar17);
        pBVar4[-1].size = iVar11;
        pBVar4[-1].bindingNdx = (int)local_228;
        pBVar4[-1].blockDeclarationNdx = (int)local_228;
        pBVar4[-1].instanceNdx = iVar10;
        local_1a8.name._M_dataplus._M_p._0_4_ = (int)local_238;
        iVar13 = (int)((ulong)((long)pUVar5 - (long)pUVar6) >> 6);
        local_210 = pBVar17;
        if ((int)local_238 < iVar13) {
          uVar31 = local_238;
          do {
            __position._M_current =
                 pBVar4[-1].activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                pBVar4[-1].activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&pBVar4[-1].activeUniformIndices,
                         __position,(int *)&local_1a8);
            }
            else {
              *__position._M_current = (int)uVar31;
              pBVar4[-1].activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            uVar9 = (uint)local_1a8.name._M_dataplus._M_p + 1;
            uVar31 = (ulong)uVar9;
            local_1a8.name._M_dataplus._M_p._0_4_ = uVar9;
          } while ((int)uVar9 < iVar13);
        }
        pppSVar1 = &local_288.
                    super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (0 < pUVar3->m_arraySize) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::ostream::operator<<(&local_1a8,iVar10);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
          plVar16 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0xb85080);
          plVar25 = plVar16 + 2;
          if ((long *)*plVar16 == plVar25) {
            local_1f8 = *plVar25;
            lStack_1f0 = plVar16[3];
            local_208 = &local_1f8;
          }
          else {
            local_1f8 = *plVar25;
            local_208 = (long *)*plVar16;
          }
          local_200 = plVar16[1];
          *plVar16 = (long)plVar25;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_208);
          plVar25 = plVar16 + 2;
          if ((pointer *)*plVar16 == (pointer *)plVar25) {
            local_288.
            super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar25;
            lStack_270 = plVar16[3];
            local_288.
            super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pppSVar1;
          }
          else {
            local_288.
            super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar25;
            local_288.
            super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar16;
          }
          local_288.
          super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar16[1];
          *plVar16 = (long)plVar25;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)local_210,
                     (ulong)local_288.
                            super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          if (local_288.
              super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)pppSVar1) {
            operator_delete(local_288.
                            super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_288.
                                  super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
          if (local_208 != &local_1f8) {
            operator_delete(local_208,local_1f8 + 1);
          }
          if (local_1c8[0] != local_1b8) {
            operator_delete(local_1c8[0],local_1b8[0] + 1);
          }
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 != iVar28);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,
                        CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                 local_260.field_2._M_local_buf[0]) + 1);
      }
      lVar30 = local_228 + 1;
    } while (lVar30 != local_240);
  }
  pBVar17 = (this->m_uniformLayout).blocks.
            super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar4 = (this->m_uniformLayout).blocks.
           super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar31 = 0;
  if (pBVar17 != pBVar4) {
    do {
      uVar9 = (int)uVar31 + pBVar17->size;
      uVar31 = (ulong)uVar9;
      pBVar17 = pBVar17 + 1;
    } while (pBVar17 != pBVar4);
    uVar31 = (ulong)(int)uVar9;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->m_data,uVar31);
  local_1a8.name._M_dataplus._M_p = local_1a8.name._M_dataplus._M_p & 0xffffffff00000000;
  if (0 < (int)((ulong)((long)(this->m_uniformLayout).blocks.
                              super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_uniformLayout).blocks.
                             super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333) {
    iVar28 = 0;
    do {
      puVar7 = (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ppvVar18 = std::
                 map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::
                 operator[](&this->m_blockPointers,(key_type_conflict *)&local_1a8);
      *ppvVar18 = puVar7 + iVar28;
      iVar28 = iVar28 + (this->m_uniformLayout).blocks.
                        super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start
                        [(int)(uint)local_1a8.name._M_dataplus._M_p].size;
      iVar11 = (uint)local_1a8.name._M_dataplus._M_p + 1;
      local_1a8.name._M_dataplus._M_p._0_4_ = iVar11;
      iVar10 = (int)((ulong)((long)(this->m_uniformLayout).blocks.
                                   super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_uniformLayout).blocks.
                                  super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4);
    } while (SBORROW4(iVar11,iVar10 * -0x33333333) != iVar11 + iVar10 * 0x33333333 < 0);
  }
  deRandom_init((deRandom *)&local_1a8,1);
  local_220 = ((long)(this->m_uniformLayout).blocks.
                     super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_uniformLayout).blocks.
                     super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
  if (0 < (int)(uint)local_220) {
    local_1e8 = &(this->m_blockPointers)._M_t._M_impl.super__Rb_tree_header;
    local_220 = (ulong)((uint)local_220 & 0x7fffffff);
    uVar31 = 0;
    do {
      p_Var19 = local_1e8;
      for (p_Var8 = (this->m_blockPointers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var8 != (_Rb_tree_header *)0x0;
          p_Var8 = (&p_Var8->_M_left)[(long)(int)*(size_t *)(p_Var8 + 1) < (long)uVar31]) {
        if ((long)uVar31 <= (long)(int)*(size_t *)(p_Var8 + 1)) {
          p_Var19 = (_Rb_tree_header *)p_Var8;
        }
      }
      p_Var26 = local_1e8;
      if ((p_Var19 != local_1e8) &&
         (p_Var26 = p_Var19, (long)uVar31 < (long)(int)p_Var19->_M_node_count)) {
        p_Var26 = local_1e8;
      }
      pBVar17 = (layout->blocks).
                super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1d8 = uVar31 * 0x50;
      local_218 = (ulong)((long)*(pointer *)
                                 ((long)&pBVar17[uVar31].activeUniformIndices.
                                         super__Vector_base<int,_std::allocator<int>_> + 8) -
                         *(long *)&pBVar17[uVar31].activeUniformIndices.
                                   super__Vector_base<int,_std::allocator<int>_>) >> 2;
      local_1e0 = uVar31;
      if (0 < (int)(uint)local_218) {
        local_240 = *(ulong *)(p_Var26 + 1);
        local_218 = (ulong)((uint)local_218 & 0x7fffffff);
        uVar31 = 0;
        do {
          pUVar5 = (this->m_uniformLayout).uniforms.
                   super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar28 = *(int *)(*(long *)((long)&(((this->m_uniformLayout).blocks.
                                               super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             activeUniformIndices).
                                             super__Vector_base<int,_std::allocator<int>_> +
                                     local_1d8) + uVar31 * 4);
          pBVar17 = (pointer)(pUVar5 + iVar28);
          local_1d0 = uVar31;
          DVar12 = glu::getDataTypeScalarType(pUVar5[iVar28].type);
          iVar11 = glu::getDataTypeScalarSize(pUVar5[iVar28].type);
          dataType = pUVar5[iVar28].type;
          bVar35 = dataType - TYPE_FLOAT_MAT2 < 9;
          bVar36 = dataType - TYPE_DOUBLE_MAT2 < 9;
          iVar28 = 1;
          if (bVar36 || bVar35) {
            if (*(char *)&(pBVar17->activeUniformIndices).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage == '\x01') {
              iVar28 = glu::getDataTypeMatrixNumRows(dataType);
            }
            else {
              iVar28 = glu::getDataTypeMatrixNumColumns(dataType);
            }
          }
          iVar10 = *(int *)&pBVar17->field_0x24;
          if (0 < iVar10) {
            local_238 = (long)iVar11 / (long)iVar28 & 0xffffffff;
            lVar30 = local_238 * 4;
            iVar11 = 0;
            local_210 = pBVar17;
            do {
              iVar13 = *(int *)&(pBVar17->activeUniformIndices).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish * iVar11;
              if (iVar10 < 2) {
                iVar13 = 0;
              }
              if (0 < iVar28) {
                local_228 = local_240 +
                            (long)iVar13 +
                            (long)*(int *)((long)&(pBVar17->activeUniformIndices).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 4);
                iVar13 = 0;
                do {
                  lVar33 = local_228;
                  lVar29 = (long)(*(int *)((long)&(pBVar17->activeUniformIndices).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish + 4) *
                                 iVar13);
                  if (!bVar36 && !bVar35) {
                    lVar29 = 0;
                  }
                  if (0 < (int)local_238) {
                    lVar34 = 0;
                    do {
                      if ((int)DVar12 < 0x1f) {
                        if (DVar12 == TYPE_FLOAT) {
                          dVar14 = deRandom_getUint32((deRandom *)&local_1a8);
                          *(float *)(lVar33 + (int)lVar34 + lVar29) =
                               (float)(int)(dVar14 % 0x13 - 9);
                        }
                        else if (DVar12 == TYPE_INT) {
                          dVar14 = deRandom_getUint32((deRandom *)&local_1a8);
                          uVar9 = dVar14 % 0x13 - 9;
                          goto LAB_006b4c2a;
                        }
                      }
                      else {
                        if (DVar12 == TYPE_UINT) {
                          dVar14 = deRandom_getUint32((deRandom *)&local_1a8);
                          uVar9 = dVar14 % 10;
                        }
                        else {
                          if (DVar12 != TYPE_BOOL) goto LAB_006b4c2e;
                          dVar15 = deRandom_getBool((deRandom *)&local_1a8);
                          uVar9 = 0;
                          if (dVar15 == 1) {
                            dVar14 = deRandom_getUint32((deRandom *)&local_1a8);
                            uVar9 = dVar14 | 1;
                          }
                        }
LAB_006b4c2a:
                        *(uint *)(lVar33 + (int)lVar34 + lVar29) = uVar9;
                      }
LAB_006b4c2e:
                      lVar34 = lVar34 + 4;
                    } while (lVar30 - lVar34 != 0);
                  }
                  iVar13 = iVar13 + 1;
                  pBVar17 = local_210;
                } while (iVar13 != iVar28);
              }
              iVar11 = iVar11 + 1;
            } while (iVar11 < *(int *)&pBVar17->field_0x24);
          }
          uVar31 = local_1d0 + 1;
        } while (uVar31 != local_218);
      }
      uVar31 = local_1e0 + 1;
    } while (uVar31 != local_220);
  }
  MVar2 = this->m_matrixLoadFlag;
  bVar35 = this->m_shuffleUniformMembers;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  pcVar20 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar20 == (char *)0x0) {
    std::ios::clear((int)&stack0xfffffffffffffd48 +
                    (int)*(undefined8 *)(local_1a8.name._M_dataplus._M_p + -0x18) + 0x110);
  }
  else {
    sVar21 = strlen(pcVar20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar20,sVar21);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"layout(location = 0) out mediump float v_vtxResult;\n",0x34);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  this_00 = &this->m_interface;
  local_288.
  super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ShaderInterface::getNamedStructs(this_00,&local_288);
  if (local_288.
      super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_288.
      super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar27 = extraout_RDX;
    ppSVar32 = local_288.
               super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      ubo::anon_unknown_0::generateDeclaration((ostringstream *)&local_1a8,*ppSVar32,(int)uVar27);
      ppSVar32 = ppSVar32 + 1;
      uVar27 = extraout_RDX_00;
    } while (ppSVar32 !=
             local_288.
             super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pSVar22 = (this->m_interface).m_uniformBlocks.
            super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_interface).m_uniformBlocks.
                              super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar22) >> 4)) {
    lVar30 = 0;
    lVar33 = 0;
    do {
      pUVar3 = *(UniformBlock **)((long)&pSVar22->m_ptr + lVar30);
      if ((pUVar3->m_flags & 0x200) != 0) {
        ubo::anon_unknown_0::generateDeclaration
                  ((ostringstream *)&local_1a8,(int)lVar33,pUVar3,layout,bVar35);
      }
      lVar33 = lVar33 + 1;
      pSVar22 = (this->m_interface).m_uniformBlocks.
                super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar30 = lVar30 + 0x10;
    } while (lVar33 < (int)((ulong)((long)(this->m_interface).m_uniformBlocks.
                                          super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar22
                                   ) >> 4));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  ubo::anon_unknown_0::generateCompareFuncs((ostream *)&local_1a8,this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tmediump float result = 1.0;\n",
             0x4c);
  ubo::anon_unknown_0::generateCompareSrc
            ((ostringstream *)&local_1a8,(char *)this_00,(ShaderInterface *)layout,
             (UniformLayout *)&this->m_blockPointers,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             &DAT_00000001,SUB41(MVar2,0),in_stack_fffffffffffffd48);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"\tv_vtxResult = result;\n}\n",0x19);
  std::__cxx11::stringbuf::str();
  if (local_288.
      super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.
                    super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.
                          super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.
                          super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::string::operator=((string *)&this->m_vertShaderSource,(string *)&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,
                    CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                             local_260.field_2._M_local_buf[0]) + 1);
  }
  MVar2 = this->m_matrixLoadFlag;
  bVar35 = this->m_shuffleUniformMembers;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  pcVar20 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar20 == (char *)0x0) {
    std::ios::clear((int)&stack0xfffffffffffffd48 +
                    (int)*(undefined8 *)(local_1a8.name._M_dataplus._M_p + -0x18) + 0x110);
  }
  else {
    sVar21 = strlen(pcVar20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar20,sVar21);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"layout(location = 0) in mediump float v_vtxResult;\n",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  local_288.
  super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ShaderInterface::getNamedStructs(this_00,&local_288);
  if (local_288.
      super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_288.
      super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar27 = extraout_RDX_01;
    ppSVar32 = local_288.
               super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      ubo::anon_unknown_0::generateDeclaration((ostringstream *)&local_1a8,*ppSVar32,(int)uVar27);
      ppSVar32 = ppSVar32 + 1;
      uVar27 = extraout_RDX_02;
    } while (ppSVar32 !=
             local_288.
             super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pSVar22 = (this->m_interface).m_uniformBlocks.
            super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_interface).m_uniformBlocks.
                              super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar22) >> 4)) {
    lVar33 = 0;
    lVar30 = 0;
    do {
      pUVar3 = *(UniformBlock **)((long)&pSVar22->m_ptr + lVar33);
      if ((pUVar3->m_flags & 0x400) != 0) {
        ubo::anon_unknown_0::generateDeclaration
                  ((ostringstream *)&local_1a8,(int)lVar30,pUVar3,layout,bVar35);
      }
      lVar30 = lVar30 + 1;
      pSVar22 = (this->m_interface).m_uniformBlocks.
                super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar33 = lVar33 + 0x10;
    } while (lVar30 < (int)((ulong)((long)(this->m_interface).m_uniformBlocks.
                                          super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar22
                                   ) >> 4));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  ubo::anon_unknown_0::generateCompareFuncs((ostream *)&local_1a8,this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"\nvoid main (void)\n{\n\tmediump float result = 1.0;\n",0x31);
  ubo::anon_unknown_0::generateCompareSrc
            ((ostringstream *)&local_1a8,(char *)this_00,(ShaderInterface *)layout,
             (UniformLayout *)&this->m_blockPointers,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)0x0
             ,SUB41(MVar2,0),in_stack_fffffffffffffd48);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"\tdEQP_FragColor = vec4(1.0, v_vtxResult, result, 1.0);\n}\n",
             0x39);
  std::__cxx11::stringbuf::str();
  if (local_288.
      super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.
                    super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.
                          super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.
                          super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::string::operator=((string *)&this->m_fragShaderSource,(string *)&local_260);
  paVar23 = &local_260.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != paVar23) {
    operator_delete(local_260._M_dataplus._M_p,
                    CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                             local_260.field_2._M_local_buf[0]) + 1);
    paVar23 = extraout_RAX;
  }
  return (int)paVar23;
}

Assistant:

void UniformBlockCase::init (void)
{
	// Compute reference layout.
	computeStd140Layout(m_uniformLayout, m_interface);

	// Assign storage for reference values.
	{
		int totalSize = 0;
		for (std::vector<BlockLayoutEntry>::const_iterator blockIter = m_uniformLayout.blocks.begin(); blockIter != m_uniformLayout.blocks.end(); blockIter++)
			totalSize += blockIter->size;
		m_data.resize(totalSize);

		// Pointers for each block.
		int curOffset = 0;
		for (int blockNdx = 0; blockNdx < (int)m_uniformLayout.blocks.size(); blockNdx++)
		{
			m_blockPointers[blockNdx] = &m_data[0] + curOffset;
			curOffset += m_uniformLayout.blocks[blockNdx].size;
		}
	}

	// Generate values.
	generateValues(m_uniformLayout, m_blockPointers, 1 /* seed */);

	// Generate shaders.
	m_vertShaderSource = generateVertexShader(m_interface, m_uniformLayout, m_blockPointers, m_matrixLoadFlag, m_shuffleUniformMembers);
	m_fragShaderSource = generateFragmentShader(m_interface, m_uniformLayout, m_blockPointers, m_matrixLoadFlag, m_shuffleUniformMembers);
}